

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall
Session::Session(Session *this,io_service *ios,string *raw_ip_address,unsigned_short port_num,
                string *request,uint id,Callback callback)

{
  pointer pcVar1;
  address aStack_48;
  
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            ((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)this,ios,(type *)0x0);
  boost::asio::ip::make_address(&aStack_48,(raw_ip_address->_M_dataplus)._M_p);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&this->m_ep,&aStack_48,port_num);
  (this->m_request)._M_dataplus._M_p = (pointer)&(this->m_request).field_2;
  pcVar1 = (request->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_request,pcVar1,pcVar1 + request->_M_string_length);
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->m_response_buf,0xffffffffffffffff,(allocator<char> *)&aStack_48);
  (this->m_response)._M_dataplus._M_p = (pointer)&(this->m_response).field_2;
  (this->m_response)._M_string_length = 0;
  (this->m_response).field_2._M_local_buf[0] = '\0';
  (this->m_ec).val_ = 0;
  (this->m_ec).failed_ = false;
  (this->m_ec).cat_ =
       (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  this->m_id = id;
  this->m_callback = callback;
  this->m_was_cancelled = false;
  (this->m_cancel_guard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_cancel_guard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_cancel_guard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_cancel_guard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_cancel_guard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

Session(asio::io_service &ios,
            const std::string &raw_ip_address,
            unsigned short port_num,
            const std::string &request,
            unsigned int id,
            Callback callback) : m_sock(ios),
                                 m_ep(asio::ip::address::from_string(raw_ip_address),
                                      port_num),
                                 m_request(request),
                                 m_id(id),
                                 m_callback(callback),
                                 m_was_cancelled(false) {}